

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::ContractBuffer(FlowBuffer *this)

{
  uchar *puVar1;
  ExceptionFlowBufferAlloc *this_00;
  size_t __size;
  
  if (DAT_00105130 <= this->buffer_length_) {
    __size = (size_t)DAT_0010512c;
    this->buffer_length_ = DAT_0010512c;
    puVar1 = (uchar *)realloc(this->buffer_,__size);
    if (puVar1 == (uchar *)0x0) {
      this_00 = (ExceptionFlowBufferAlloc *)__cxa_allocate_exception(0x20);
      ExceptionFlowBufferAlloc::ExceptionFlowBufferAlloc(this_00,"contract realloc OOM");
      __cxa_throw(this_00,&ExceptionFlowBufferAlloc::typeinfo,Exception::~Exception);
    }
    this->buffer_ = puVar1;
  }
  return;
}

Assistant:

void FlowBuffer::ContractBuffer()
	{
	if ( buffer_length_ < policy.contract_threshold )
		return;

	buffer_length_ = policy.min_capacity;
	unsigned char* new_buf = (unsigned char*)realloc(buffer_, buffer_length_);

	if ( ! new_buf )
		throw ExceptionFlowBufferAlloc("contract realloc OOM");

	buffer_ = new_buf;
	}